

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

int __thiscall
ON_Mesh::GetVertexEdges
          (ON_Mesh *this,int vertex_index_count,int *vertex_index,bool bNoDuplicates,
          ON_SimpleArray<ON_2dex> *edges)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ON_MeshTopologyVertex *pOVar5;
  ON_MeshTopologyEdge *pOVar6;
  ON_SimpleArray<ON_2dex> *pOVar7;
  ON_MeshFace *pOVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  ulong uVar15;
  ON_MeshFace *pOVar16;
  long lVar17;
  ON_2dex edge_ends;
  ON_Workspace ws;
  ON_2dex local_b0;
  int *local_a8;
  ON_SimpleArray<ON_2dex> *local_a0;
  ON_Mesh *local_98;
  ulong local_90;
  ON_MeshFace *local_88;
  ulong local_80;
  int local_74;
  undefined4 local_70;
  uint local_6c;
  int *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ON_MeshTopologyVertex *local_48;
  ON_Workspace local_40;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  iVar10 = 0;
  iVar11 = 0;
  if ((((2 < (int)uVar1) &&
       (uVar15 = (ulong)(uint)vertex_index_count, iVar11 = iVar10, 0 < vertex_index_count)) &&
      (vertex_index != (int *)0x0)) &&
     (uVar2 = (this->m_F).m_count, local_80 = (ulong)uVar2, 0 < (int)uVar2)) {
    local_60 = (long)edges->m_count;
    local_88 = (this->m_F).m_a;
    local_70 = (undefined4)CONCAT71(in_register_00000009,bNoDuplicates);
    local_a8 = vertex_index;
    local_a0 = edges;
    if ((((this->m_top).m_b32IsValid == 1) &&
        (uVar2 = (this->m_top).m_topv_map.m_count, uVar1 == uVar2)) &&
       (local_6c = (this->m_top).m_tope.m_count, 0 < (int)local_6c)) {
      if ((int)uVar2 < 1) {
        local_68 = (int *)0x0;
      }
      else {
        local_68 = (this->m_top).m_topv_map.m_a;
      }
      local_98 = this;
      if (0 < vertex_index_count) {
        local_74 = (this->m_top).m_topv.m_count;
        uVar14 = 0;
        local_58 = uVar15;
        do {
          uVar2 = local_a8[uVar14];
          local_50 = uVar14;
          if (uVar2 < uVar1) {
            lVar13 = (long)local_68[uVar2];
            if ((-1 < lVar13) && (local_68[uVar2] <= local_74)) {
              local_b0.i = uVar2;
              pOVar5 = (local_98->m_top).m_topv.m_a;
              if (0 < pOVar5[lVar13].m_tope_count) {
                local_48 = pOVar5 + lVar13;
                uVar15 = 0;
                do {
                  uVar9 = local_48->m_topei[uVar15];
                  local_90 = uVar15;
                  if ((uVar9 < local_6c) &&
                     (pOVar6 = (local_98->m_top).m_tope.m_a, 0 < pOVar6[(int)uVar9].m_topf_count)) {
                    lVar13 = 0;
                    do {
                      pOVar16 = local_88;
                      uVar3 = pOVar6[(int)uVar9].m_topfi[lVar13];
                      if (uVar3 < (uint)local_80) {
                        lVar17 = 3;
                        do {
                          if (local_88[uVar3].vi[lVar17 + -3] == uVar2) {
                            uVar4 = local_88[uVar3].vi[(uint)lVar17 & 3];
                            if (uVar2 != uVar4 && uVar4 < uVar1) {
                              local_b0.j = uVar2;
                              local_b0.i = uVar4;
                              ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
                            }
                            if ((lVar17 == 5) && (pOVar16[uVar3].vi[2] == pOVar16[uVar3].vi[3])) {
                              uVar15 = 0;
                            }
                            else {
                              uVar15 = (ulong)((uint)lVar17 - 2 & 3);
                            }
                            uVar3 = pOVar16[uVar3].vi[uVar15];
                            if (uVar2 != uVar3 && uVar3 < uVar1) {
                              local_b0.j = uVar3;
                              local_b0.i = uVar2;
                              ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
                            }
                            break;
                          }
                          lVar17 = lVar17 + 1;
                        } while (lVar17 != 7);
                      }
                      lVar13 = lVar13 + 1;
                    } while (lVar13 < pOVar6[(int)uVar9].m_topf_count);
                  }
                  uVar15 = local_90 + 1;
                } while ((long)uVar15 < (long)local_48->m_tope_count);
              }
            }
          }
          uVar14 = local_50 + 1;
        } while (uVar14 != local_58);
      }
    }
    else {
      ON_Workspace::ON_Workspace(&local_40);
      if (1 < vertex_index_count) {
        uVar14 = 1;
        do {
          if (local_a8[uVar14] < local_a8[uVar14 - 1]) {
            piVar12 = ON_Workspace::GetIntMemory(&local_40,uVar15);
            memcpy(piVar12,local_a8,uVar15 * 4);
            ON_SortIntArray(quick_sort,piVar12,uVar15);
            local_a8 = piVar12;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar15 != uVar14);
      }
      if (0 < (int)(uint)local_80) {
        uVar14 = 0;
        pOVar16 = local_88;
        do {
          pOVar8 = local_88;
          lVar13 = 3;
          local_90 = uVar14;
          do {
            uVar2 = pOVar16->vi[lVar13 + -3];
            piVar12 = ON_BinarySearchIntArray(uVar2,local_a8,uVar15);
            if (piVar12 != (int *)0x0) {
              uVar9 = pOVar8[uVar14].vi[(uint)lVar13 & 3];
              if ((uVar9 < uVar1) && (uVar2 != uVar9)) {
                local_b0.j = uVar2;
                local_b0.i = uVar9;
                ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
              }
              if ((lVar13 == 5) && (pOVar8[uVar14].vi[2] == pOVar8[uVar14].vi[3])) {
                uVar9 = 0;
              }
              else {
                uVar9 = (uint)lVar13 - 2 & 3;
              }
              uVar9 = pOVar8[uVar14].vi[uVar9];
              if ((uVar9 < uVar1) && (uVar2 != uVar9)) {
                local_b0.j = uVar9;
                local_b0.i = uVar2;
                ON_SimpleArray<ON_2dex>::Append(local_a0,&local_b0);
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 7);
          uVar14 = local_90 + 1;
          pOVar16 = pOVar16 + 1;
        } while (uVar14 != local_80);
      }
      ON_Workspace::~ON_Workspace(&local_40);
    }
    lVar13 = local_60;
    pOVar7 = local_a0;
    iVar11 = (int)local_60;
    if (((char)local_70 != '\0') && (iVar11 < local_a0->m_count)) {
      iVar10 = local_a0->m_count;
      lVar17 = local_60;
      if (iVar11 < iVar10) {
        do {
          local_b0 = local_a0->m_a[lVar17];
          iVar10 = local_b0.j;
          if (local_b0.j < local_b0.i) {
            local_b0.j = local_b0.i;
            local_b0.i = iVar10;
            local_a0->m_a[lVar17] = local_b0;
          }
          lVar17 = lVar17 + 1;
          iVar10 = local_a0->m_count;
        } while (lVar17 < iVar10);
      }
      ON_qsort(local_a0->m_a + local_60,(long)(iVar10 - iVar11),8,ON_MeshGetVertexEdges_Compare2dex)
      ;
      local_b0 = pOVar7->m_a[lVar13];
      uVar15 = lVar13 + 1;
      iVar10 = (int)uVar15;
      if (iVar10 < pOVar7->m_count) {
        lVar13 = uVar15 * 8;
        uVar14 = uVar15 & 0xffffffff;
        do {
          iVar10 = ON_Compare2dex(&local_b0,(ON_2dex *)((long)&pOVar7->m_a->i + lVar13));
          if (iVar10 != 0) {
            local_b0 = *(ON_2dex *)((long)&pOVar7->m_a->i + lVar13);
            iVar10 = (int)uVar14;
            if ((int)uVar15 != iVar10) {
              pOVar7->m_a[iVar10] = local_b0;
            }
            uVar14 = (ulong)(iVar10 + 1);
          }
          iVar10 = (int)uVar14;
          uVar15 = uVar15 + 1;
          lVar13 = lVar13 + 8;
        } while ((long)uVar15 < (long)pOVar7->m_count);
      }
      if ((-1 < iVar10) && (iVar10 <= pOVar7->m_capacity)) {
        pOVar7->m_count = iVar10;
      }
    }
    iVar11 = pOVar7->m_count - iVar11;
  }
  return iVar11;
}

Assistant:

int ON_Mesh::GetVertexEdges( 
  int vertex_index_count,
  const int* vertex_index, 
  bool bNoDuplicates,
  ON_SimpleArray<ON_2dex>& edges
  ) const
{
  // Get edges connected to vertices in vertex_index[] array.
  const int edges_count0 = edges.Count();

  const int mesh_vcount = m_V.Count();

  //03/12/2007 TimH. The line below appears to be a typo.  Using the following line works better.
  //const int mesh_fcount = m_V.Count();
  const int mesh_fcount = m_F.Count();

  if (   vertex_index_count <= 0 || 0 == vertex_index 
      || mesh_fcount <= 0 || mesh_vcount < 3 )
  {
    return 0;
  }

  int vei, efi, fvi, ei, fi, j, n, vi;
  const int* f_vi;
  ON_2dex edge_ends;
  const ON_MeshFace* f = m_F.Array();

  if (   TopologyExists()
       && mesh_vcount == m_top.m_topv_map.Count()
       && m_top.m_tope.Count() > 0 )
  {
    // Topology looks good; use it to speed up the search.
    const int* topv_map = m_top.m_topv_map;
    const int top_vcount = m_top.m_topv.Count();
    const int top_ecount = m_top.m_tope.Count();
    int top_vi;
    for ( n = 0; n < vertex_index_count; n++ )
    {
      vi = vertex_index[n];
      if ( vi < 0 || vi >= mesh_vcount )
        continue;
      top_vi = topv_map[vi];
      if ( top_vi < 0 || top_vi > top_vcount )
        continue;
      edge_ends.i = vi;
      const ON_MeshTopologyVertex& v = m_top.m_topv[top_vi];
      for ( vei = 0; vei < v.m_tope_count; vei++ )
      {
        ei = v.m_topei[vei];
        if ( ei < 0 || ei >= top_ecount )
          continue;
        const ON_MeshTopologyEdge& e = m_top.m_tope[ei];
        for ( efi = 0; efi < e.m_topf_count; efi++ )
        {
          fi = e.m_topfi[efi];
          if ( fi < 0 || fi >= mesh_fcount )
            continue;
          f_vi = f[fi].vi;
          for ( fvi = 0; fvi < 4; fvi++ )
          {
            if ( f_vi[fvi] == vi )
            {
              j = f_vi[(fvi+3)%4];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = j;
                edge_ends.j = vi;
                edges.Append(edge_ends);
              }
              j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = vi;
                edge_ends.j = j;
                edges.Append(edge_ends);
              }
              break; // done with this face
            }
          }
        }
      }
    }
  }
  else
  {
    // slow-n-stupid search through all the faces

    // Sort vertex_index[] array so we can use a quick
    // binary search to see if a face is using one of 
    // the vertices in the list.
    ON_Workspace ws;
    for ( vi = 1; vi < vertex_index_count; vi++ )
    {
      if ( vertex_index[vi] < vertex_index[vi-1] )
      {
        // need to sort vertex_index[] array
        int* tmp = ws.GetIntMemory(vertex_index_count);
        memcpy(tmp,vertex_index,vertex_index_count*sizeof(tmp[0]));
        ON_SortIntArray(ON::sort_algorithm::quick_sort,tmp,vertex_index_count);
        vertex_index = tmp;
        break;
      }
    }

    // Find all the faces that use a vertex in the vertex_index[] array.
    for ( fi = 0; fi < mesh_fcount; fi++ )
    {
      f_vi = f[fi].vi;
      for ( fvi = 0; fvi < 4; fvi++ )
      {
        vi = f_vi[fvi];
        if ( ON_BinarySearchIntArray(vi,vertex_index,vertex_index_count) )
        {
          // vi is in the vertex_index[] array.  Add the edges
          // of this face that begin and end at this vertex.
          j = f_vi[(fvi+3)%4];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = j;
            edge_ends.j = vi;
            edges.Append(edge_ends);
          }
          j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = vi;
            edge_ends.j = j;
            edges.Append(edge_ends);
          }
        }
      }
    }
  }

  if ( bNoDuplicates && edges.Count() > edges_count0 )
  {
    for ( ei = edges_count0; ei < edges.Count(); ei++ )
    {
      edge_ends = edges[ei];
      if ( edge_ends.i > edge_ends.j )
      {
        j = edge_ends.i; edge_ends.i = edge_ends.j; edge_ends.j = j;
        edges[ei] = edge_ends;
      }
    }
    ON_qsort( edges.Array() + edges_count0,
              edges.Count() - edges_count0,
              sizeof(edge_ends), 
              ON_MeshGetVertexEdges_Compare2dex);
    edge_ends = edges[edges_count0];
    for ( ei = j = edges_count0+1; ei < edges.Count(); ei++ )
    {
      if ( ON_Compare2dex(&edge_ends,&edges[ei]) )
      {
        edge_ends = edges[ei];
        if ( j != ei )
          edges[j] = edge_ends;
        j++;
      }
    }
    edges.SetCount(j);
  }

  return (edges.Count() - edges_count0);
}